

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O1

bool intgemm::anon_unknown_0::Test<intgemm::SSE2::Kernels16>
               (float *input_unaligned,float quant_mult,size_t size)

{
  float *pfVar1;
  float *pfVar2;
  short *psVar3;
  bool bVar4;
  IResultCapture *pIVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  size_t sVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  AlignedVector<float> input;
  AlignedVector<short> test;
  AlignedVector<short> ref;
  char local_f9;
  float local_f8;
  AlignedVector<float> local_e8;
  AlignedVector<short> local_d8;
  AlignedVector<short> local_c8;
  double local_b8;
  SourceLineInfo local_b0;
  StringRef local_a0;
  MessageBuilder local_90;
  
  local_f8 = quant_mult;
  AlignedVector<float>::AlignedVector(&local_e8,size,0x40);
  memcpy(local_e8.mem_,input_unaligned,size * 4);
  AlignedVector<short>::AlignedVector(&local_c8,size,0x40);
  AlignedVector<short>::AlignedVector(&local_d8,size,0x40);
  psVar3 = local_c8.mem_;
  pfVar2 = local_e8.mem_;
  if ((size & 0xffffffff) != 0) {
    uVar8 = 0;
    do {
      fVar10 = roundf(pfVar2[uVar8] * local_f8);
      if (fVar10 <= -32768.0) {
        fVar10 = -32768.0;
      }
      if (32767.0 <= fVar10) {
        fVar10 = 32767.0;
      }
      psVar3[uVar8] = (short)(int)fVar10;
      uVar8 = uVar8 + 1;
    } while ((size & 0xffffffff) != uVar8);
  }
  if (size == 0) {
    bVar7 = true;
  }
  else {
    lVar6 = 0;
    do {
      pfVar1 = (float *)((long)pfVar2 + lVar6 * 2);
      auVar11._0_4_ = (int)(*pfVar1 * local_f8);
      auVar11._4_4_ = (int)(pfVar1[1] * local_f8);
      auVar11._8_4_ = (int)(pfVar1[2] * local_f8);
      auVar11._12_4_ = (int)(pfVar1[3] * local_f8);
      auVar12._4_4_ = (int)(pfVar1[5] * local_f8);
      auVar12._0_4_ = (int)(pfVar1[4] * local_f8);
      auVar12._8_4_ = (int)(pfVar1[6] * local_f8);
      auVar12._12_4_ = (int)(pfVar1[7] * local_f8);
      auVar12 = packssdw(auVar11,auVar12);
      *(undefined1 (*) [16])((long)local_d8.mem_ + lVar6) = auVar12;
      lVar6 = lVar6 + 0x10;
    } while (pfVar1 + 8 != pfVar2 + (size & 0xffffffff));
    local_b8 = (double)local_f8;
    bVar7 = true;
    sVar9 = 0;
    do {
      bVar4 = IsOff<short>(local_e8.mem_[sVar9] * local_f8,local_c8.mem_[sVar9],local_d8.mem_[sVar9]
                          );
      if (bVar4) {
        pIVar5 = Catch::getResultCapture();
        local_a0.m_start = anon_var_dwarf_2352f0;
        local_a0.m_size = 0xd;
        local_b0.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/quantize_test.cc"
        ;
        local_b0.line = 0x5f;
        Catch::MessageBuilder::MessageBuilder(&local_90,&local_a0,&local_b0,Info);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,"Error at ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)local_90.super_MessageStream.m_stream.m_oss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," from ",6);
        std::ostream::_M_insert<double>((double)local_e8.mem_[sVar9]);
        local_f9 = '*';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,&local_f9,1);
        std::ostream::_M_insert<double>(local_b8);
        local_f9 = '=';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss,&local_f9,1);
        std::ostream::_M_insert<double>((double)(local_e8.mem_[sVar9] * local_f8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," ref = ",7);
        std::ostream::operator<<
                  (local_90.super_MessageStream.m_stream.m_oss,(int)local_c8.mem_[sVar9]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_90.super_MessageStream.m_stream.m_oss," test = ",8);
        std::ostream::operator<<
                  (local_90.super_MessageStream.m_stream.m_oss,(int)local_d8.mem_[sVar9]);
        (*pIVar5->_vptr_IResultCapture[8])(pIVar5,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.m_info.message._M_dataplus._M_p != &local_90.m_info.message.field_2) {
          operator_delete(local_90.m_info.message._M_dataplus._M_p);
        }
        Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_90);
        bVar7 = false;
      }
      sVar9 = sVar9 + 1;
    } while (size != sVar9);
  }
  free(local_d8.mem_);
  free(local_c8.mem_);
  free(local_e8.mem_);
  return bVar7;
}

Assistant:

bool Test(const float *input_unaligned, float quant_mult, std::size_t size) {
  using Integer = typename Backend::Integer;
  bool success = true;
  AlignedVector<float> input(size);
  std::memcpy(input.begin(), input_unaligned, sizeof(float) * size);

  AlignedVector<Integer> ref(size);
  AlignedVector<Integer> test(size);
  QuantizeRef(input.begin(), ref.begin(), quant_mult, static_cast<Index>(size));
  Backend::Quantize(input.begin(), test.begin(), quant_mult, static_cast<Index>(size));
  for (std::size_t i = 0; i < size; ++i) {
    if (IsOff(input[i] * quant_mult, ref[i], test[i])) {
      UNSCOPED_INFO("Error at " << i << " from " << input[i] << '*' << quant_mult << '=' << (input[i]*quant_mult) << " ref = " << static_cast<int>(ref[i]) << " test = " << static_cast<int>(test[i]));
      success = false;
    }
  }
  return success;
}